

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp.cpp
# Opt level: O0

bool duckdb::Timestamp::TryFromDatetime(date_t date,dtime_tz_t timetz,timestamp_t *result)

{
  timestamp_t timestamp;
  bool bVar1;
  int32_t iVar2;
  dtime_t time;
  int64_t *in_RDX;
  time_t *in_RSI;
  undefined4 in_EDI;
  int64_t offset;
  timestamp_t *in_stack_ffffffffffffffd0;
  date_t in_stack_ffffffffffffffe0;
  dtime_tz_t local_10;
  bool local_1;
  
  time.micros = dtime_tz_t::time(&local_10,in_RSI);
  bVar1 = TryFromDatetime(in_stack_ffffffffffffffe0,time,in_stack_ffffffffffffffd0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    iVar2 = dtime_tz_t::offset((dtime_tz_t *)0x2bb7895);
    bVar1 = TryAddOperator::Operation<long,_long,_long>(*in_RDX,(long)iVar2 * -1000000,in_RDX);
    if (bVar1) {
      timestamp.value._4_4_ = in_EDI;
      timestamp.value._0_4_ = in_stack_ffffffffffffffe0.days;
      local_1 = IsFinite(timestamp);
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Timestamp::TryFromDatetime(date_t date, dtime_tz_t timetz, timestamp_t &result) {
	if (!TryFromDatetime(date, timetz.time(), result)) {
		return false;
	}
	// Offset is in seconds
	const auto offset = int64_t(timetz.offset() * Interval::MICROS_PER_SEC);
	if (!TryAddOperator::Operation(result.value, -offset, result.value)) {
		return false;
	}
	return Timestamp::IsFinite(result);
}